

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniformxx.hpp
# Opt level: O3

ret_t trng::utility::u01xx_traits<double,_1UL,_trng::yarn3s>::addin(yarn3s *r)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  
  iVar2 = (r->S).r[0];
  iVar4 = (r->S).r[1];
  uVar5 = (long)(r->S).r[2] * (long)(r->P).a[2] +
          (long)(r->P).a[1] * (long)iVar4 + (long)(r->P).a[0] * (long)iVar2;
  (r->S).r[2] = iVar4;
  (r->S).r[1] = iVar2;
  uVar5 = (uVar5 >> 0x1f) * -0x7fffadb3 + uVar5;
  uVar5 = (uVar5 >> 0x1f) * -0x7fffadb3 + uVar5;
  uVar1 = (uint)uVar5;
  uVar3 = uVar1 + 0x8000524d;
  if (uVar5 < 0x7fffadb3) {
    uVar3 = uVar1;
  }
  (r->S).r[0] = uVar3;
  if (uVar3 != 0) {
    uVar5 = ((ulong)*(uint *)(yarn3s::g + (ulong)(uVar3 & 0xffff) * 4) *
             (ulong)*(uint *)(yarn3s::g + (long)((int)uVar3 >> 0x10) * 4 + 0x40000) >> 0x1f) *
            -0x7fffadb3 +
            (ulong)*(uint *)(yarn3s::g + (ulong)(uVar3 & 0xffff) * 4) *
            (ulong)*(uint *)(yarn3s::g + (long)((int)uVar3 >> 0x10) * 4 + 0x40000);
    uVar5 = (uVar5 >> 0x1f) * -0x7fffadb3 + uVar5;
    iVar4 = (int)uVar5;
    iVar2 = iVar4 + -0x7fffadb3;
    if (uVar5 < 0x7fffadb3) {
      iVar2 = iVar4;
    }
    return (double)iVar2;
  }
  return 0.0;
}

Assistant:

TRNG_CUDA_ENABLE
      static ret_t addin(prng_t &r) {
        const result_type x{r() - prng_t::min()};
        if (int_ok)
          return static_cast<ret_t>(static_cast<int>(x));
        else if (long_ok)
          return static_cast<ret_t>(static_cast<long>(x));
        else if (long_long_ok)
          return static_cast<ret_t>(static_cast<long long>(x));
        else if (use_ll_of_shifted)
          return static_cast<ret_t>(static_cast<long long>(x >> 1));
        else
          return static_cast<ret_t>(x);
      }